

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.hpp
# Opt level: O0

parse_error * __thiscall
nlohmann::json_abi_v3_12_0::detail::parse_error::position_string_abi_cxx11_
          (parse_error *this,position_t *pos)

{
  __cxx11 local_58 [32];
  __cxx11 local_38 [32];
  position_t *local_18;
  position_t *pos_local;
  
  local_18 = pos;
  pos_local = (position_t *)this;
  std::__cxx11::to_string(local_38,pos->lines_read + 1);
  std::__cxx11::to_string(local_58,local_18->chars_read_current_line);
  concat<std::__cxx11::string,char_const(&)[10],std::__cxx11::string,char_const(&)[10],std::__cxx11::string>
            ((detail *)this,(char (*) [10])" at line ",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
             (char (*) [10])", column ",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string((string *)local_38);
  return this;
}

Assistant:

static std::string position_string(const position_t& pos)
    {
        return concat(" at line ", std::to_string(pos.lines_read + 1),
                      ", column ", std::to_string(pos.chars_read_current_line));
    }